

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  char cVar2;
  char cVar3;
  undefined1 *puVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined1 *puStack_40;
  double local_38;
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = -NAN;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  iVar5 = isDate(context,argc,argv,(DateTime *)local_58);
  if (iVar5 == 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_20 = &DAT_aaaaaaaaaaaaaaaa;
    computeHMS((DateTime *)local_58);
    puVar4 = uStack_20;
    cVar2 = (char)(local_48._4_4_ / 10);
    cVar3 = (char)((int)puStack_40 / 10);
    local_28._0_6_ =
         CONCAT15(0x3a,CONCAT14((char)puStack_40 + cVar3 * -10 + '0',
                                CONCAT13(cVar3 + (char)(((int)puStack_40 / 10) / 10) * -10 + '0',
                                         CONCAT12(0x3a,CONCAT11((char)((ulong)local_48 >> 0x20) +
                                                                cVar2 * -10 + '0',
                                                                cVar2 + (char)((local_48._4_4_ / 10)
                                                                              / 10) * -10 + '0')))))
    ;
    if (((ulong)local_30 & 0x400000000) == 0) {
      iVar5 = (int)local_38 / 10;
      local_28._0_7_ =
           CONCAT16((char)iVar5 +
                    ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x22) - (char)(iVar5 >> 0x1f)
                    ) * -10 + '0',(undefined6)local_28);
      local_28 = (undefined1 *)
                 CONCAT17((char)(int)local_38 + (char)iVar5 * -10 + '0',(undefined7)local_28);
      uStack_20 = (undefined1 *)((ulong)uStack_20 & 0xffffffffffffff00);
      iVar5 = 8;
    }
    else {
      iVar6 = (int)(local_38 * 1000.0 + 0.5);
      iVar5 = iVar6 / 10000;
      local_28._0_7_ =
           CONCAT16((char)iVar5 +
                    ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x22) - (char)(iVar5 >> 0x1f)
                    ) * -10 + '0',(undefined6)local_28);
      iVar5 = iVar6 / 1000;
      local_28 = (undefined1 *)
                 CONCAT17((char)iVar5 +
                          ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x22) -
                          (char)(iVar5 >> 0x1f)) * -10 + '0',(undefined7)local_28);
      iVar5 = iVar6 / 100;
      iVar1 = iVar6 / 10;
      uStack_20._5_3_ = SUB83(puVar4,5);
      uStack_20._0_5_ =
           (uint5)CONCAT13((char)iVar6 + (char)iVar1 * -10 + '0',
                           CONCAT12((char)iVar1 +
                                    ((char)(uint)((ulong)((long)iVar1 * 0x66666667) >> 0x22) -
                                    (char)(iVar1 >> 0x1f)) * -10 + '0',
                                    CONCAT11((char)iVar5 +
                                             ((char)(uint)((ulong)((long)iVar5 * 0x66666667) >> 0x22
                                                          ) - (char)(iVar5 >> 0x1f)) * -10 + '0',
                                             0x2e)));
      iVar5 = 0xc;
    }
    setResultStrOrError(context,(char *)&local_28,iVar5,'\x01',
                        (_func_void_void_ptr *)0xffffffffffffffff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int s, n;
    char zBuf[16];
    computeHMS(&x);
    zBuf[0] = '0' + (x.h/10)%10;
    zBuf[1] = '0' + (x.h)%10;
    zBuf[2] = ':';
    zBuf[3] = '0' + (x.m/10)%10;
    zBuf[4] = '0' + (x.m)%10;
    zBuf[5] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[6] = '0' + (s/10000)%10;
      zBuf[7] = '0' + (s/1000)%10;
      zBuf[8] = '.';
      zBuf[9] = '0' + (s/100)%10;
      zBuf[10] = '0' + (s/10)%10;
      zBuf[11] = '0' + (s)%10;
      zBuf[12] = 0;
      n = 12;
    }else{
      s = (int)x.s;
      zBuf[6] = '0' + (s/10)%10;
      zBuf[7] = '0' + (s)%10;
      zBuf[8] = 0;
      n = 8;
    }
    sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
  }
}